

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O3

bool Jinx::Impl::StringToValueType(String *value,ValueType *outValue)

{
  int iVar1;
  ValueType VVar2;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::compare
                    (value,"null");
  if (iVar1 == 0) {
    VVar2 = Null;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            compare(value,"number");
    if (iVar1 == 0) {
      VVar2 = Number;
    }
    else {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              compare(value,"integer");
      if (iVar1 == 0) {
        VVar2 = Integer;
      }
      else {
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                compare(value,"boolean");
        if (iVar1 == 0) {
          VVar2 = Boolean;
        }
        else {
          iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  compare(value,"string");
          if (iVar1 == 0) {
            VVar2 = String;
          }
          else {
            iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                    ::compare(value,"collection");
            if (iVar1 == 0) {
              VVar2 = Collection;
            }
            else {
              iVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::compare
                                (value,"collectionitr");
              if (iVar1 == 0) {
                VVar2 = CollectionItr;
              }
              else {
                iVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::compare
                                  (value,"function");
                if (iVar1 == 0) {
                  VVar2 = Function;
                }
                else {
                  iVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                          compare(value,"buffer");
                  if (iVar1 == 0) {
                    VVar2 = Buffer;
                  }
                  else {
                    iVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                            compare(value,"guid");
                    if (iVar1 == 0) {
                      VVar2 = Guid;
                    }
                    else {
                      iVar1 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                              compare(value,"valtype");
                      if (iVar1 != 0) {
                        return false;
                      }
                      VVar2 = ValType;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *outValue = VVar2;
  return true;
}

Assistant:

inline_t bool StringToValueType(const String & value, ValueType * outValue)
	{
		if (value == "null")
		{
			*outValue = ValueType::Null;
			return true;
		}
		else if (value == "number")
		{
			*outValue = ValueType::Number;
			return true;
		}
		else if (value == "integer")
		{
			*outValue = ValueType::Integer;
			return true;
		}
		else if (value == "boolean")
		{
			*outValue = ValueType::Boolean;
			return true;
		}
		else if (value == "string")
		{
			*outValue = ValueType::String;
			return true;
		}
		else if (value == "collection")
		{
			*outValue = ValueType::Collection;
			return true;
		}
		else if (value == "collectionitr")
		{
			*outValue = ValueType::CollectionItr;
			return true;
		}
		else if (value == "function")
		{
			*outValue = ValueType::Function;
			return true;
		}
		else if (value == "buffer")
		{
			*outValue = ValueType::Buffer;
			return true;
		}
		else if (value == "guid")
		{
			*outValue = ValueType::Guid;
			return true;
		}
		else if (value == "valtype")
		{
			*outValue = ValueType::ValType;
			return true;
		}
		return false;
	}